

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O3

int ffgphd(fitsfile *fptr,int maxdim,int *simple,int *bitpix,int *naxis,LONGLONG *naxes,long *pcount
          ,long *gcount,int *extend,double *bscale,double *bzero,LONGLONG *blank,int *nspace,
          int *status)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  uint nrec;
  long lVar7;
  char name [75];
  LONGLONG axislen;
  long longbitpix;
  int namelen;
  char message [81];
  char comm [73];
  char xtension [71];
  char card [81];
  char keyword [75];
  long local_2b0;
  char local_2a8 [80];
  undefined4 local_258;
  short sStack_254;
  undefined1 uStack_252;
  undefined1 uStack_251;
  char local_250;
  LONGLONG local_200;
  long local_1f8;
  int local_1ec;
  char local_1e8 [96];
  char local_188 [80];
  int local_138;
  short sStack_134;
  undefined2 uStack_132;
  char local_130;
  char local_e8 [96];
  char local_88 [88];
  
  if (0 < *status) {
    return *status;
  }
  if (fptr->HDUposition != fptr->Fptr->curhdu) {
    ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
  }
  if (simple != (int *)0x0) {
    *simple = 1;
  }
  ffgkyn(fptr,1,(char *)&local_258,local_2a8,local_188,status);
  if (fptr->Fptr->curhdu == 0) {
    if (CONCAT13(uStack_252,CONCAT21(sStack_254,local_258._3_1_)) != 0x454c50 ||
        local_258 != 0x504d4953) {
      snprintf(local_1e8,0x51,"First keyword of the file is not SIMPLE: %s",&local_258);
      ffpmsg(local_1e8);
      *status = 0xdd;
      return 0xdd;
    }
    bVar3 = false;
    if (local_2a8[0] != 'T') {
      if (local_2a8[0] != 'F') {
        *status = 0xdc;
        return 0xdc;
      }
      bVar3 = false;
      if (simple != (int *)0x0) {
        *simple = 0;
      }
    }
    goto LAB_0017927a;
  }
  if (local_250 != '\0' ||
      CONCAT17(uStack_251,CONCAT16(uStack_252,CONCAT24(sStack_254,local_258))) != 0x4e4f49534e455458
     ) {
    snprintf(local_1e8,0x51,"First keyword of the extension is not XTENSION: %s",&local_258);
    ffpmsg(local_1e8);
    *status = 0xe1;
    return 0xe1;
  }
  iVar4 = ffc2s(local_2a8,(char *)&local_138,status);
  if (0 < iVar4) {
    ffpmsg("Bad value string for XTENSION keyword:");
    pcVar6 = local_2a8;
    goto LAB_00179115;
  }
  if ((local_2a8[0] == '\'') &&
     ((bVar3 = false, sStack_134 == 0x45 && local_138 == 0x47414d49 ||
      (local_130 == '\0' &&
       CONCAT26(uStack_132,CONCAT24(sStack_134,local_138)) == 0x4547414d49455549)))) {
LAB_0017927a:
    ffgkyn(fptr,2,(char *)&local_258,local_2a8,local_188,status);
    if (CONCAT13(uStack_252,CONCAT21(sStack_254,local_258._3_1_)) != 0x584950 ||
        local_258 != 0x50544942) {
      snprintf(local_1e8,0x51,"Second keyword of the extension is not BITPIX: %s",&local_258);
      ffpmsg(local_1e8);
      *status = 0xde;
      return 0xde;
    }
    iVar4 = ffc2ii(local_2a8,&local_1f8,status);
    if (iVar4 < 1) {
      if ((((local_1f8 - 8U < 0x39) && ((0x100000001000101U >> (local_1f8 - 8U & 0x3f) & 1) != 0))
          || (local_1f8 == -0x40)) || (local_1f8 == -0x20)) {
        if (bitpix != (int *)0x0) {
          *bitpix = (int)local_1f8;
        }
        ffgtkn(fptr,3,"NAXIS",&local_2b0,status);
        if (*status == 0xd0) {
          *status = 0xdf;
          return 0xdf;
        }
        if (999 < local_2b0 || *status == 0xd1) {
          snprintf(local_1e8,0x51,"NAXIS = %ld is illegal");
          ffpmsg(local_1e8);
          *status = 0xd4;
          return 0xd4;
        }
        if (naxis != (int *)0x0) {
          *naxis = (int)local_2b0;
        }
        if (local_2b0 < 1) {
          nrec = 4;
        }
        else {
          lVar7 = 0;
          do {
            lVar1 = lVar7 + 1;
            ffkeyn("NAXIS",(int)lVar1,local_88,status);
            ffgtknjj(fptr,(int)lVar7 + 4,local_88,&local_200,status);
            if (*status == 0xd1) {
              *status = 0xd5;
              return 0xd5;
            }
            if (*status == 0xd0) {
              *status = 0xe0;
              return 0xe0;
            }
            if (lVar7 < maxdim && naxes != (LONGLONG *)0x0) {
              naxes[lVar7] = local_200;
            }
            lVar7 = lVar1;
          } while (lVar1 < local_2b0);
          nrec = (int)lVar1 + 4;
        }
        goto LAB_00179532;
      }
      pcVar6 = "Illegal value for BITPIX keyword: %s";
    }
    else {
      pcVar6 = "Value of BITPIX keyword is not an integer: %s";
    }
    snprintf(local_1e8,0x51,pcVar6,local_2a8);
    ffpmsg(local_1e8);
    *status = 0xd3;
    iVar5 = 0xd3;
  }
  else {
    snprintf(local_1e8,0x51,"This is not an IMAGE extension: %s",local_2a8);
    ffpmsg(local_1e8);
    if (fptr->Fptr->compressimg == 0) {
      bVar3 = true;
      goto LAB_0017927a;
    }
    ffxmsg(3,local_1e8);
    if ((bitpix != (int *)0x0) && (ffgidt(fptr,bitpix,status), 0 < *status)) {
      pcVar6 = "Error reading BITPIX value of compressed image";
LAB_00179115:
      ffpmsg(pcVar6);
      return *status;
    }
    if ((naxis != (int *)0x0) && (ffgidm(fptr,naxis,status), 0 < *status)) {
      pcVar6 = "Error reading NAXIS value of compressed image";
      goto LAB_00179115;
    }
    nrec = 9;
    bVar3 = false;
    if ((naxes != (LONGLONG *)0x0) && (ffgiszll(fptr,maxdim,naxes,status), 0 < *status)) {
      pcVar6 = "Error reading NAXISn values of compressed image";
      goto LAB_00179115;
    }
LAB_00179532:
    if (bscale != (double *)0x0) {
      *bscale = 1.0;
    }
    if (bzero != (double *)0x0) {
      *bzero = 0.0;
    }
    if (pcount != (long *)0x0) {
      *pcount = 0;
    }
    if (gcount != (long *)0x0) {
      *gcount = 1;
    }
    if (extend != (int *)0x0) {
      *extend = 0;
    }
    if (blank != (LONGLONG *)0x0) {
      *blank = 0x4995cdd1;
    }
    *nspace = 0;
    iVar4 = *status;
    do {
      iVar5 = ffgrec(fptr,nrec,local_e8,status);
      if (0 < iVar5) {
        if (*status != 0xcb) {
          ffpmsg("Failed to find the END keyword in header (ffgphd).");
LAB_00179608:
          bVar2 = true;
          goto LAB_00179888;
        }
        *status = iVar4;
        iVar5 = iVar4;
        if (0 < iVar4) {
LAB_00179abc:
          pcVar6 = "Failed to read the required image extension header keywords.";
          if (fptr->Fptr->curhdu == 0) {
            pcVar6 = "Failed to read the required primary array header keywords.";
          }
          goto LAB_00179115;
        }
        break;
      }
      ffgknm(local_e8,(char *)&local_258,&local_1ec,status);
      iVar5 = fftrec((char *)&local_258,status);
      if (0 < iVar5) {
        snprintf(local_1e8,0x51,"Name of keyword no. %d contains illegal character(s): %s",
                 (ulong)nrec,&local_258);
        ffpmsg(local_1e8);
        if ((nrec / 0x24) * 0x24 == nrec) {
          ffpmsg("  (This may indicate a missing END keyword).");
        }
      }
      if ((bscale == (double *)0x0) ||
         (CONCAT13(uStack_252,CONCAT21(sStack_254,local_258._3_1_)) != 0x454c41 ||
          local_258 != 0x41435342)) {
        if ((bzero == (double *)0x0) || (sStack_254 != 0x4f || local_258 != 0x52455a42)) {
          if ((blank == (LONGLONG *)0x0) || (sStack_254 != 0x4b || local_258 != 0x4e414c42)) {
            if ((pcount == (long *)0x0) ||
               (CONCAT13(uStack_252,CONCAT21(sStack_254,local_258._3_1_)) != 0x544e55 ||
                local_258 != 0x554f4350)) {
              if ((gcount == (long *)0x0) ||
                 (CONCAT13(uStack_252,CONCAT21(sStack_254,local_258._3_1_)) != 0x544e55 ||
                  local_258 != 0x554f4347)) {
                if ((extend == (int *)0x0) ||
                   (CONCAT13(uStack_252,CONCAT21(sStack_254,local_258._3_1_)) != 0x444e45 ||
                    local_258 != 0x45545845)) {
                  if (local_258 != 0x444e45) {
                    if (local_e8[0] == '\0') {
                      *nspace = *nspace + 1;
                    }
                    else {
                      *nspace = 0;
                    }
                    goto LAB_00179608;
                  }
                  bVar2 = false;
                  goto LAB_00179888;
                }
                *nspace = 0;
                ffpsvc(local_e8,local_2a8,local_188,status);
                iVar5 = ffc2ll(local_2a8,extend,status);
                if (0 < iVar5) {
                  *status = iVar4;
                  *extend = 0;
                  pcVar6 = "Error reading EXTEND keyword value as a logical: %s";
                  goto LAB_0017986c;
                }
                goto LAB_00179885;
              }
              *nspace = 0;
              ffpsvc(local_e8,local_2a8,local_188,status);
              iVar5 = ffc2ii(local_2a8,gcount,status);
              if (0 < iVar5) {
                pcVar6 = "Error reading GCOUNT keyword value as an integer: %s";
                goto LAB_001799b0;
              }
            }
            else {
              *nspace = 0;
              ffpsvc(local_e8,local_2a8,local_188,status);
              iVar5 = ffc2ii(local_2a8,pcount,status);
              if (0 < iVar5) {
                pcVar6 = "Error reading PCOUNT keyword value as an integer: %s";
LAB_001799b0:
                snprintf(local_1e8,0x51,pcVar6,local_2a8);
                ffpmsg(local_1e8);
              }
            }
            bVar2 = true;
            goto LAB_00179888;
          }
          *nspace = 0;
          ffpsvc(local_e8,local_2a8,local_188,status);
          iVar5 = ffc2jj(local_2a8,blank,status);
          if (0 < iVar5) {
            *status = iVar4;
            *blank = 0x4995cdd1;
            pcVar6 = "Error reading BLANK keyword value as an integer: %s";
            goto LAB_0017986c;
          }
        }
        else {
          *nspace = 0;
          ffpsvc(local_e8,local_2a8,local_188,status);
          iVar5 = ffc2dd(local_2a8,bzero,status);
          if (0 < iVar5) {
            *status = iVar4;
            *bzero = 0.0;
            pcVar6 = "Error reading BZERO keyword value as a double: %s";
            goto LAB_0017986c;
          }
        }
      }
      else {
        *nspace = 0;
        ffpsvc(local_e8,local_2a8,local_188,status);
        iVar5 = ffc2dd(local_2a8,bscale,status);
        if (0 < iVar5) {
          *status = iVar4;
          *bscale = 1.0;
          pcVar6 = "Error reading BSCALE keyword value as a double: %s";
LAB_0017986c:
          snprintf(local_1e8,0x51,pcVar6,local_2a8);
          ffpmsg(local_1e8);
        }
      }
LAB_00179885:
      bVar2 = true;
LAB_00179888:
      iVar5 = *status;
      if (0 < iVar5) goto LAB_00179abc;
      nrec = nrec + 1;
    } while (bVar2);
    if (bVar3) {
      *status = 0xe9;
      iVar5 = 0xe9;
    }
  }
  return iVar5;
}

Assistant:

int ffgphd(fitsfile *fptr,  /* I - FITS file pointer                        */
           int maxdim,      /* I - maximum no. of dimensions to read;       */
           int *simple,     /* O - does file conform to FITS standard? 1/0  */
           int *bitpix,     /* O - number of bits per data value pixel      */
           int *naxis,      /* O - number of axes in the data array         */
           LONGLONG naxes[],    /* O - length of each data axis                 */
           long *pcount,    /* O - number of group parameters (usually 0)   */
           long *gcount,    /* O - number of random groups (usually 1 or 0) */
           int *extend,     /* O - may FITS file haave extensions?          */
           double *bscale,  /* O - array pixel linear scaling factor        */
           double *bzero,   /* O - array pixel linear scaling zero point    */
           LONGLONG *blank, /* O - value used to represent undefined pixels */
           int *nspace,     /* O - number of blank keywords prior to END    */
           int *status)     /* IO - error status                            */
{
/*
  Get the Primary HeaDer parameters.  Check that the keywords conform to
  the FITS standard and return the parameters which determine the size and
  structure of the primary array or IMAGE extension.
*/
    int unknown, found_end, tstatus, ii, nextkey, namelen;
    long longbitpix, longnaxis;
    LONGLONG axislen;
    char message[FLEN_ERRMSG], keyword[FLEN_KEYWORD];
    char card[FLEN_CARD];
    char name[FLEN_KEYWORD], value[FLEN_VALUE], comm[FLEN_COMMENT];
    char xtension[FLEN_VALUE];

    if (*status > 0)
        return(*status);

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    if (simple)
       *simple = 1;

    unknown = 0;

    /*--------------------------------------------------------------------*/
    /*  Get 1st keyword of HDU and test whether it is SIMPLE or XTENSION  */
    /*--------------------------------------------------------------------*/
    ffgkyn(fptr, 1, name, value, comm, status);

    if ((fptr->Fptr)->curhdu == 0) /* Is this the beginning of the FITS file? */
    {
        if (!strcmp(name, "SIMPLE"))
        {
            if (value[0] == 'F')
            {
                if (simple)
                    *simple=0;          /* not a simple FITS file */
            }
            else if (value[0] != 'T')
                return(*status = BAD_SIMPLE);
        }

        else
        {
            snprintf(message, FLEN_ERRMSG,
                   "First keyword of the file is not SIMPLE: %s", name);
            ffpmsg(message);
            return(*status = NO_SIMPLE);
        }
    }

    else    /* not beginning of the file, so presumably an IMAGE extension */
    {       /* or it could be a compressed image in a binary table */

        if (!strcmp(name, "XTENSION"))
        {
            if (ffc2s(value, xtension, status) > 0)  /* get the value string */
            {
                ffpmsg("Bad value string for XTENSION keyword:");
                ffpmsg(value);
                return(*status);
            }

            /* allow the quoted string value to begin in any column and */
            /* allow any number of trailing blanks before the closing quote */
            if ( (value[0] != '\'')   ||  /* first char must be a quote */
                  ( strcmp(xtension, "IMAGE")  &&
                    strcmp(xtension, "IUEIMAGE") ) )
            {
                unknown = 1;  /* unknown type of extension; press on anyway */
                snprintf(message, FLEN_ERRMSG,
                   "This is not an IMAGE extension: %s", value);
                ffpmsg(message);
            }
        }

        else  /* error: 1st keyword of extension != XTENSION */
        {
            snprintf(message, FLEN_ERRMSG,
            "First keyword of the extension is not XTENSION: %s", name);
            ffpmsg(message);
            return(*status = NO_XTENSION);
        }
    }

    if (unknown && (fptr->Fptr)->compressimg)
    {
        /* this is a compressed image, so read ZBITPIX, ZNAXIS keywords */
        unknown = 0;  /* reset flag */
        ffxmsg(3, message); /* clear previous spurious error message */

        if (bitpix)
        {
            ffgidt(fptr, bitpix, status); /* get bitpix value */

            if (*status > 0)
            {
                ffpmsg("Error reading BITPIX value of compressed image");
                return(*status);
            }
        }

        if (naxis)
        {
            ffgidm(fptr, naxis, status); /* get NAXIS value */

            if (*status > 0)
            {
                ffpmsg("Error reading NAXIS value of compressed image");
                return(*status);
            }
        }

        if (naxes)
        {
            ffgiszll(fptr, maxdim, naxes, status);  /* get NAXISn value */

            if (*status > 0)
            {
                ffpmsg("Error reading NAXISn values of compressed image");
                return(*status);
            }
        }

        nextkey = 9; /* skip required table keywords in the following search */
    }
    else
    {

        /*----------------------------------------------------------------*/
        /*  Get 2nd keyword;  test whether it is BITPIX with legal value  */
        /*----------------------------------------------------------------*/
        ffgkyn(fptr, 2, name, value, comm, status);  /* BITPIX = 2nd keyword */

        if (strcmp(name, "BITPIX"))
        {
            snprintf(message, FLEN_ERRMSG,
            "Second keyword of the extension is not BITPIX: %s", name);
            ffpmsg(message);
            return(*status = NO_BITPIX);
        }

        if (ffc2ii(value,  &longbitpix, status) > 0)
        {
            snprintf(message, FLEN_ERRMSG,
            "Value of BITPIX keyword is not an integer: %s", value);
            ffpmsg(message);
            return(*status = BAD_BITPIX);
        }
        else if (longbitpix != BYTE_IMG && longbitpix != SHORT_IMG &&
             longbitpix != LONG_IMG && longbitpix != LONGLONG_IMG &&
             longbitpix != FLOAT_IMG && longbitpix != DOUBLE_IMG)
        {
            snprintf(message, FLEN_ERRMSG,
            "Illegal value for BITPIX keyword: %s", value);
            ffpmsg(message);
            return(*status = BAD_BITPIX);
        }
        if (bitpix)
            *bitpix = longbitpix;  /* do explicit type conversion */

        /*---------------------------------------------------------------*/
        /*  Get 3rd keyword;  test whether it is NAXIS with legal value  */
        /*---------------------------------------------------------------*/
        ffgtkn(fptr, 3, "NAXIS",  &longnaxis, status);

        if (*status == BAD_ORDER)
            return(*status = NO_NAXIS);
        else if (*status == NOT_POS_INT || longnaxis > 999)
        {
            snprintf(message,FLEN_ERRMSG,"NAXIS = %ld is illegal", longnaxis);
            ffpmsg(message);
            return(*status = BAD_NAXIS);
        }
        else
            if (naxis)
                 *naxis = longnaxis;  /* do explicit type conversion */

        /*---------------------------------------------------------*/
        /*  Get the next NAXISn keywords and test for legal values */
        /*---------------------------------------------------------*/
        for (ii=0, nextkey=4; ii < longnaxis; ii++, nextkey++)
        {
            ffkeyn("NAXIS", ii+1, keyword, status);
            ffgtknjj(fptr, 4+ii, keyword, &axislen, status);

            if (*status == BAD_ORDER)
                return(*status = NO_NAXES);
            else if (*status == NOT_POS_INT)
                return(*status = BAD_NAXES);
            else if (ii < maxdim)
                if (naxes)
                    naxes[ii] = axislen;
        }
    }

    /*---------------------------------------------------------*/
    /*  now look for other keywords of interest:               */
    /*  BSCALE, BZERO, BLANK, PCOUNT, GCOUNT, EXTEND, and END  */
    /*---------------------------------------------------------*/

    /*  initialize default values in case keyword is not present */
    if (bscale)
        *bscale = 1.0;
    if (bzero)
        *bzero  = 0.0;
    if (pcount)
        *pcount = 0;
    if (gcount)
        *gcount = 1;
    if (extend)
        *extend = 0;
    if (blank)
      *blank = NULL_UNDEFINED; /* no default null value for BITPIX=8,16,32 */

    *nspace = 0;
    found_end = 0;
    tstatus = *status;

    for (; !found_end; nextkey++)  
    {
      /* get next keyword */
      /* don't use ffgkyn here because it trys to parse the card to read */
      /* the value string, thus failing to read the file just because of */
      /* minor syntax errors in optional keywords.                       */

      if (ffgrec(fptr, nextkey, card, status) > 0 )  /* get the 80-byte card */
      {
        if (*status == KEY_OUT_BOUNDS)
        {
          found_end = 1;  /* simply hit the end of the header */
          *status = tstatus;  /* reset error status */
        }
        else          
        {
          ffpmsg("Failed to find the END keyword in header (ffgphd).");
        }
      }
      else /* got the next keyword without error */
      {
        ffgknm(card, name, &namelen, status); /* get the keyword name */

        if (fftrec(name, status) > 0)  /* test keyword name; catches no END */
        {
          snprintf(message, FLEN_ERRMSG,
              "Name of keyword no. %d contains illegal character(s): %s",
              nextkey, name);
          ffpmsg(message);

          if (nextkey % 36 == 0) /* test if at beginning of 36-card record */
            ffpmsg("  (This may indicate a missing END keyword).");
        }

        if (!strcmp(name, "BSCALE") && bscale)
        {
            *nspace = 0;  /* reset count of blank keywords */
            ffpsvc(card, value, comm, status); /* parse value and comment */

            if (ffc2dd(value, bscale, status) > 0) /* convert to double */
            {
                /* reset error status and continue, but still issue warning */
                *status = tstatus;
                *bscale = 1.0;

                snprintf(message, FLEN_ERRMSG,
                "Error reading BSCALE keyword value as a double: %s", value);
                ffpmsg(message);
            }
        }

        else if (!strcmp(name, "BZERO") && bzero)
        {
            *nspace = 0;  /* reset count of blank keywords */
            ffpsvc(card, value, comm, status); /* parse value and comment */

            if (ffc2dd(value, bzero, status) > 0) /* convert to double */
            {
                /* reset error status and continue, but still issue warning */
                *status = tstatus;
                *bzero = 0.0;

                snprintf(message, FLEN_ERRMSG,
                "Error reading BZERO keyword value as a double: %s", value);
                ffpmsg(message);
            }
        }

        else if (!strcmp(name, "BLANK") && blank)
        {
            *nspace = 0;  /* reset count of blank keywords */
            ffpsvc(card, value, comm, status); /* parse value and comment */

            if (ffc2jj(value, blank, status) > 0) /* convert to LONGLONG */
            {
                /* reset error status and continue, but still issue warning */
                *status = tstatus;
                *blank = NULL_UNDEFINED;

                snprintf(message, FLEN_ERRMSG,
                "Error reading BLANK keyword value as an integer: %s", value);
                ffpmsg(message);
            }
        }

        else if (!strcmp(name, "PCOUNT") && pcount)
        {
            *nspace = 0;  /* reset count of blank keywords */
            ffpsvc(card, value, comm, status); /* parse value and comment */

            if (ffc2ii(value, pcount, status) > 0) /* convert to long */
            {
                snprintf(message, FLEN_ERRMSG,
                "Error reading PCOUNT keyword value as an integer: %s", value);
                ffpmsg(message);
            }
        }

        else if (!strcmp(name, "GCOUNT") && gcount)
        {
            *nspace = 0;  /* reset count of blank keywords */
            ffpsvc(card, value, comm, status); /* parse value and comment */

            if (ffc2ii(value, gcount, status) > 0) /* convert to long */
            {
                snprintf(message, FLEN_ERRMSG,
                "Error reading GCOUNT keyword value as an integer: %s", value);
                ffpmsg(message);
            }
        }

        else if (!strcmp(name, "EXTEND") && extend)
        {
            *nspace = 0;  /* reset count of blank keywords */
            ffpsvc(card, value, comm, status); /* parse value and comment */

            if (ffc2ll(value, extend, status) > 0) /* convert to logical */
            {
                /* reset error status and continue, but still issue warning */
                *status = tstatus;
                *extend = 0;

                snprintf(message, FLEN_ERRMSG,
                "Error reading EXTEND keyword value as a logical: %s", value);
                ffpmsg(message);
            }
        }

        else if (!strcmp(name, "END"))
            found_end = 1;

        else if (!card[0] )
            *nspace = *nspace + 1;  /* this is a blank card in the header */

        else
            *nspace = 0;  /* reset count of blank keywords immediately
                            before the END keyword to zero   */
      }

      if (*status > 0)  /* exit on error after writing error message */
      {
        if ((fptr->Fptr)->curhdu == 0)
            ffpmsg(
            "Failed to read the required primary array header keywords.");
        else
            ffpmsg(
            "Failed to read the required image extension header keywords.");

        return(*status);
      }
    }

    if (unknown)
       *status = NOT_IMAGE;

    return(*status);
}